

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O0

void __thiscall duckdb::ColumnStatsUnifier::~ColumnStatsUnifier(ColumnStatsUnifier *this)

{
  code *pcVar1;
  ColumnStatsUnifier *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~ColumnStatsUnifier() = default;